

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::DefineImportName
          (CWriter *this,Import *import,string_view module,string_view field_name)

{
  string_view wasm_name;
  char type_suffix;
  ExternalKind EVar1;
  FuncImport *pFVar2;
  TagImport *pTVar3;
  GlobalImport *pGVar4;
  MemoryImport *pMVar5;
  TableImport *pTVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar7;
  undefined1 local_a0 [8];
  string mangled;
  ModuleFieldType local_5c;
  undefined1 local_58 [4];
  ModuleFieldType type;
  string name;
  Import *import_local;
  CWriter *this_local;
  string_view field_name_local;
  string_view module_local;
  
  name.field_2._8_8_ = import;
  std::__cxx11::string::string((string *)local_58);
  EVar1 = Import::kind((Import *)name.field_2._8_8_);
  switch(EVar1) {
  case First:
    local_5c = Func;
    pFVar2 = cast<wabt::FuncImport,wabt::Import>((Import *)name.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_58,(string *)&pFVar2->func);
    break;
  case Table:
    local_5c = Table;
    pTVar6 = cast<wabt::TableImport,wabt::Import>((Import *)name.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_58,(string *)&pTVar6->table);
    break;
  case Memory:
    local_5c = Memory;
    pMVar5 = cast<wabt::MemoryImport,wabt::Import>((Import *)name.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_58,(string *)&pMVar5->memory);
    break;
  case Global:
    local_5c = Global;
    pGVar4 = cast<wabt::GlobalImport,wabt::Import>((Import *)name.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_58,(string *)&pGVar4->global);
    break;
  case Last:
    local_5c = Tag;
    pTVar3 = cast<wabt::TagImport,wabt::Import>((Import *)name.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_58,(string *)&pTVar3->tag);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->import_syms_,(value_type *)local_58);
  pVar7 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string&,std::__cxx11::string_const&>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->import_module_sym_map_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (name.field_2._8_8_ + 8));
  mangled.field_2._8_8_ = pVar7.first._M_node;
  (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
            ((string *)local_a0,(CWriter *)this,module,field_name);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&this->global_syms_,(key_type *)local_a0);
  type_suffix = MangleField(local_5c);
  wasm_name = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
  ClaimName(this,&this->global_syms_,&this->global_sym_map_,type_suffix,wasm_name,(string *)local_a0
           );
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void CWriter::DefineImportName(const Import* import,
                               std::string_view module,
                               std::string_view field_name) {
  std::string name;
  ModuleFieldType type;

  switch (import->kind()) {
    case ExternalKind::Func:
      type = ModuleFieldType::Func;
      name = cast<FuncImport>(import)->func.name;
      break;
    case ExternalKind::Tag:
      type = ModuleFieldType::Tag;
      name = cast<TagImport>(import)->tag.name;
      break;
    case ExternalKind::Global:
      type = ModuleFieldType::Global;
      name = cast<GlobalImport>(import)->global.name;
      break;
    case ExternalKind::Memory:
      type = ModuleFieldType::Memory;
      name = cast<MemoryImport>(import)->memory.name;
      break;
    case ExternalKind::Table:
      type = ModuleFieldType::Table;
      name = cast<TableImport>(import)->table.name;
      break;
  }

  import_syms_.insert(name);
  import_module_sym_map_.emplace(name, import->module_name);

  const std::string mangled = ExportName(module, field_name);
  global_syms_.erase(mangled);  // duplicate imports are allowed
  ClaimName(global_syms_, global_sym_map_, MangleField(type), name, mangled);
}